

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void __thiscall Interpreter::InterpretLine(Interpreter *this,string *line)

{
  iterator *piVar1;
  pointer pcVar2;
  _Elt_pointer pWVar3;
  pointer pbVar4;
  undefined2 uVar5;
  char *extraout_RDX;
  pointer pbVar6;
  Word tokword;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  char *local_98;
  char *pcStack_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  anon_union_16_2_ba345be5_for_m_Storage local_68;
  ulong local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = " ";
  pcStack_90 = "";
  boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
            ((is_any_ofF<char> *)&local_68,(iterator_range<const_char_*> *)&local_98);
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
            (&local_88,line,(is_any_ofF<char> *)&local_68,token_compress_off);
  if ((0x10 < local_58) && (local_68.m_dynSet != (set_value_type *)0x0)) {
    operator_delete__(local_68.m_dynSet);
  }
  pbVar4 = local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar6 = local_88.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar2 = (pbVar6->_M_dataplus)._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar2,pcVar2 + pbVar6->_M_string_length);
      uVar5 = huelang::DefinitionTable::TokToWord(this,(string *)local_50);
      local_98 = (char *)CONCAT62(local_98._2_6_,uVar5);
      pcStack_90 = extraout_RDX;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      pWVar3 = ((iterator *)
               ((long)&(this->env).executionStack.
                       super_stack<huelang::Word,_std::deque<huelang::Word,_std::allocator<huelang::Word>_>_>
                       .c.super__Deque_base<huelang::Word,_std::allocator<huelang::Word>_>._M_impl.
                       super__Deque_impl_data + 0x30))->_M_cur;
      if (pWVar3 == *(_Elt_pointer *)
                     ((long)&(this->env).executionStack.
                             super_stack<huelang::Word,_std::deque<huelang::Word,_std::allocator<huelang::Word>_>_>
                             .c.super__Deque_base<huelang::Word,_std::allocator<huelang::Word>_>.
                             _M_impl.super__Deque_impl_data + 0x40) + -1) {
        std::deque<huelang::Word,std::allocator<huelang::Word>>::
        _M_push_back_aux<huelang::Word_const&>
                  ((deque<huelang::Word,std::allocator<huelang::Word>> *)&(this->env).executionStack
                   ,(Word *)&local_98);
      }
      else {
        *(char **)pWVar3 = local_98;
        pWVar3->minor = (unsigned_long)pcStack_90;
        piVar1 = (iterator *)
                 ((long)&(this->env).executionStack.
                         super_stack<huelang::Word,_std::deque<huelang::Word,_std::allocator<huelang::Word>_>_>
                         .c.super__Deque_base<huelang::Word,_std::allocator<huelang::Word>_>._M_impl
                         .super__Deque_impl_data + 0x30);
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      huelang::Environment::Run();
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return;
}

Assistant:

void Interpreter::InterpretLine (string line) {
    vector<string> tokens;
    split(tokens, line, is_any_of(" "));
    
    for (string& tok: tokens) {
        Word tokword = env.definitionTable.TokToWord(tok);
        env.executionStack.push(tokword);
        env.Run();
    }
}